

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  bool bVar2;
  UnitTestImpl *this_00;
  TimeInMillis TVar3;
  OsStackTraceGetterInterface *pOVar4;
  Test *this_01;
  TimeInMillis TVar5;
  
  if (this->should_run_ == true) {
    this_00 = internal::GetUnitTestImpl();
    this_00->current_test_info_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
    TVar3 = internal::GetTimeInMillis();
    pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar4->_vptr_OsStackTraceGetterInterface[3])(pOVar4);
    this_01 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    if (this_01 != (Test *)0x0) {
      bVar2 = Test::HasFatalFailure();
      if (!bVar2) {
        Test::Run(this_01);
      }
    }
    pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar4->_vptr_OsStackTraceGetterInterface[3])(pOVar4);
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this_01,0x122c38,(char *)0x0);
    TVar5 = internal::GetTimeInMillis();
    (this->result_).elapsed_time_ = TVar5 - TVar3;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[9])(pTVar1,this);
    this_00->current_test_info_ = (TestInfo *)0x0;
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test only if the test object was created and its
  // constructor didn't generate a fatal failure.
  if ((test != NULL) && !Test::HasFatalFailure()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  // Deletes the test object.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      test, &Test::DeleteSelf_, "the test fixture's destructor");

  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(NULL);
}